

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

int __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *this_00;
  GLuint program;
  RenderContext *context;
  string *a;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined7 extraout_var;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  string *a_00;
  unsigned_short uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int x;
  int iVar17;
  deUint8 *ptr;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_270;
  RGBA threshold;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  int local_200;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface reference;
  Surface rendered;
  Vector<float,_4> local_180;
  Vec4 color;
  PixelBufferAccess dstAccess;
  Vec4 v10;
  Vector<float,_4> local_118;
  string imageSetDesc;
  Vec4 v11;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vec4 v00;
  Vec4 v01;
  int *piVar4;
  
  uVar11 = (ulong)ctx & 0xffffffff;
  iVar2 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  piVar4 = (int *)CONCAT44(extraout_var_00,iVar2);
  uVar5 = (long)*piVar4 / 8 & 0xffffffff;
  if (0x7f < (int)((long)*piVar4 / 8)) {
    uVar5 = 0x80;
  }
  iVar2 = 0x80;
  if (piVar4[1] / 8 < 0x80) {
    iVar2 = piVar4[1] / 8;
  }
  program = (this->m_program->m_program).m_program;
  dstAccess.super_ConstPixelBufferAccess.m_format.order =
       (ChannelOrder)tcu::PixelFormat::getColorThreshold((PixelFormat *)(piVar4 + 2));
  imageSetDesc._M_dataplus._M_p._0_4_ = 0x3030303;
  threshold = tcu::operator+((RGBA *)&dstAccess,(RGBA *)&imageSetDesc);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&rendered);
  tcu::Surface::Surface(&reference);
  local_270 = (int)uVar5;
  uVar18 = iVar2 * local_270;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&positions,(long)(int)(uVar18 * 4));
  iVar3 = 0;
  uVar9 = 0;
  if (0 < local_270) {
    uVar9 = uVar5;
  }
  iVar8 = 0;
  if (0 < iVar2) {
    iVar8 = iVar2;
  }
  iVar14 = 3;
  while (iVar3 != iVar8) {
    fVar19 = (float)iVar3;
    iVar3 = iVar3 + 1;
    fVar19 = fVar19 / (float)iVar2;
    fVar20 = (float)iVar3 / (float)iVar2;
    fVar19 = fVar19 + fVar19 + -1.0;
    fVar20 = fVar20 + fVar20 + -1.0;
    uVar16 = 0;
    iVar15 = iVar14;
    while (uVar9 != uVar16) {
      fVar21 = (float)(int)uVar16 / (float)local_270;
      uVar16 = uVar16 + 1;
      fVar22 = (float)(int)uVar16 / (float)local_270;
      fVar21 = fVar21 + fVar21 + -1.0;
      fVar22 = fVar22 + fVar22 + -1.0;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -3].m_data[0] = fVar21;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -3].m_data[1] = fVar19;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -2].m_data[0] = fVar21;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -2].m_data[1] = fVar20;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -1].m_data[0] = fVar22;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15 + -1].m_data[1] = fVar19;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15].m_data[0] = fVar22;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar15].m_data[1] = fVar20;
      iVar15 = iVar15 + 4;
    }
    iVar14 = iVar14 + local_270 * 4;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&indices,(long)(int)(uVar18 * 6));
  lVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar18) {
    uVar9 = (ulong)uVar18;
  }
  uVar12 = 3;
  for (; uVar9 * 6 - lVar7 != 0; lVar7 = lVar7 + 6) {
    iVar3 = (int)lVar7;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = uVar12 - 1;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + 1] = uVar12 - 3;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + 2] = uVar12 - 2;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + 3] = uVar12 - 1;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + 4] = uVar12 - 2;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + 5] = uVar12;
    uVar12 = uVar12 + 4;
  }
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x88eb,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,local_270 * 8,iVar2 << 3);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_positionBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8892,
             (long)positions.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)positions.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             positions.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_indexBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8893,
             (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)ctx);
  uVar18 = uVar18 * 0xc;
  iVar3 = (int)tbs;
  local_200 = (int)siglen;
  iVar2 = 0;
  do {
    iVar8 = iVar2;
    uVar10 = 0xc;
    uVar13 = iVar3 - iVar8;
    if (uVar13 == 0 || iVar3 < iVar8) break;
    iVar2 = iVar3 + -0xc;
    if ((0xb < (int)uVar13) &&
       (uVar13 = uVar13 - uVar13 % 0xc, iVar2 = iVar8, uVar10 = uVar13, (int)uVar18 < (int)uVar13))
    {
      uVar13 = uVar18;
      uVar10 = uVar18;
    }
    uVar11 = (long)(int)uVar10 / 0xc;
    iVar14 = (int)uVar11;
    uVar9 = uVar11;
    if (local_270 < iVar14) {
      uVar9 = uVar5;
    }
    uVar16 = (ulong)(uint)(iVar14 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v10,"Bytes ",(allocator<char> *)&local_118);
    fVar19 = (float)(iVar2 + local_200);
    color.m_data[0] = fVar19;
    de::toString<int>((string *)&v01,(int *)&color);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v10,
                   (string *)&v01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstAccess,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v00," to ")
    ;
    local_180.m_data[0] = (float)((int)fVar19 + uVar10 + -1);
    de::toString<int>((string *)&v11,(int *)&local_180);
    std::operator+(&imageSetDesc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstAccess,
                   (string *)&v11);
    std::__cxx11::string::~string((string *)&v11);
    std::__cxx11::string::~string((string *)&dstAccess);
    std::__cxx11::string::~string((string *)&v00);
    std::__cxx11::string::~string((string *)&v01);
    std::__cxx11::string::~string((string *)&v10);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)(int)fVar19);
    glu::CallLogWrapper::glDrawElements(this_00,4,iVar14 * 6,0x1403,(void *)0x0);
    iVar15 = (int)uVar9;
    uVar11 = (ulong)(uint)(iVar14 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
    tcu::Surface::setSize
              (&reference,iVar15 * 8,
               (((int)((long)uVar11 / (long)iVar15) + 1) -
               (uint)((int)((long)uVar11 % (long)iVar15) == 0)) * 8);
    tcu::Surface::getAccess(&dstAccess,&reference);
    v00.m_data[0] = 0.0;
    v00.m_data[1] = 0.0;
    v00.m_data[2] = 0.0;
    v00.m_data[3] = 3.57331e-43;
    tcu::clear(&dstAccess,(IVec4 *)&v00);
    ptr = sig + (long)iVar2 + (long)local_200;
    iVar2 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; iVar2 != iVar14; iVar2 = iVar2 + 1) {
      uVar10 = iVar2 * 4;
      fetchVtxColor((BufferTestUtil *)&v00,ptr,uVar10);
      fetchVtxColor((BufferTestUtil *)&v10,ptr,uVar10 | 1);
      fetchVtxColor((BufferTestUtil *)&v01,ptr,uVar10 | 2);
      fetchVtxColor((BufferTestUtil *)&v11,ptr,uVar10 | 3);
      for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
        fVar19 = ((float)iVar6 + 0.5) * 0.125;
        for (iVar17 = 0;
            b = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v11,
            iVar17 != 8; iVar17 = iVar17 + 1) {
          fVar21 = ((float)iVar17 + 0.5) * 0.125;
          fVar22 = fVar19 + fVar21;
          fVar20 = 1.0 - fVar19;
          if (fVar22 <= 1.0) {
            b = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v00;
            fVar20 = fVar19;
          }
          a_00 = (string *)&v01;
          a = (string *)&v10;
          if (fVar22 <= 1.0) {
            a_00 = (string *)&v10;
            a = (string *)&v01;
          }
          tcu::operator-((tcu *)&local_88,(Vector<float,_4> *)a,(Vector<float,_4> *)b);
          tcu::operator*((tcu *)&local_118,
                         (float)(-(uint)(fVar22 <= 1.0) & (uint)fVar21 |
                                ~-(uint)(fVar22 <= 1.0) & (uint)(1.0 - fVar21)),&local_88);
          tcu::operator+((tcu *)&local_180,(Vector<float,_4> *)b,&local_118);
          tcu::operator-((tcu *)&local_a8,(Vector<float,_4> *)a_00,(Vector<float,_4> *)b);
          tcu::operator*((tcu *)&local_98,fVar20,&local_a8);
          tcu::operator+((tcu *)&color,&local_180,&local_98);
          tcu::PixelBufferAccess::setPixel
                    (&dstAccess,&color,(iVar2 % iVar15) * 8 + iVar17,iVar6 + (iVar2 / iVar15) * 8,0)
          ;
        }
      }
    }
    tcu::Surface::setSize
              (&rendered,iVar15 * 8,
               (((int)((long)uVar16 / (long)local_270) + 1) -
               (uint)((int)((long)uVar16 % (long)local_270) == 0)) * 8);
    context = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess(&dstAccess,&rendered);
    glu::readPixels(context,0,0,&dstAccess);
    bVar1 = tcu::pixelThresholdCompare
                      ((this->super_BufferVerifierBase).m_log,"RenderResult",
                       (char *)CONCAT44(imageSetDesc._M_dataplus._M_p._4_4_,
                                        imageSetDesc._M_dataplus._M_p._0_4_),&reference,&rendered,
                       &threshold,COMPARE_LOG_RESULT);
    uVar11 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    std::__cxx11::string::~string((string *)&imageSetDesc);
    iVar2 = uVar13 + iVar8;
  } while ((char)uVar11 != '\0');
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  tcu::Surface::~Surface(&reference);
  tcu::Surface::~Surface(&rendered);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return (int)CONCAT71((int7)(uVar11 >> 8),iVar3 <= iVar8);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(3,3,3,3);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_PIXEL_PACK_BUFFER, 0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glBindVertexArray			(m_vao);

	// Upload positions
	glBindBuffer				(GL_ARRAY_BUFFER, m_positionBuf);
	glBufferData				(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STATIC_DRAW);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

	// Upload indices
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER, m_indexBuf);
	glBufferData				(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size()*sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);

	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, DE_NULL);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_renderCtx, 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}